

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::trapIfGt
          (ModuleRunnerBase<wasm::ModuleRunner> *this,uint64_t lhs,uint64_t rhs,char *msg)

{
  ExternalInterface *pEVar1;
  size_t sVar2;
  ostream *poVar3;
  stringstream local_1d8 [8];
  stringstream ss;
  long local_1c8 [14];
  ios_base local_158 [264];
  long *local_50;
  long local_40 [2];
  
  if (rhs < lhs) {
    std::__cxx11::stringstream::stringstream(local_1d8);
    if (msg == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_1c8 + (int)*(undefined8 *)(local_1c8[0] + -0x18));
    }
    else {
      sVar2 = strlen(msg);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,msg,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,": ",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," > ",3);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pEVar1 = this->externalInterface;
    std::__cxx11::stringbuf::str();
    (*pEVar1->_vptr_ExternalInterface[8])(pEVar1,local_50);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1d8);
    std::ios_base::~ios_base(local_158);
  }
  return;
}

Assistant:

void trapIfGt(uint64_t lhs, uint64_t rhs, const char* msg) {
    if (lhs > rhs) {
      std::stringstream ss;
      ss << msg << ": " << lhs << " > " << rhs;
      externalInterface->trap(ss.str().c_str());
    }
  }